

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::OpenPopupEx(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  int remaining;
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiPopupData *pIVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImVec2 *pIVar7;
  ImGuiPopupData local_68;
  
  pIVar5 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  remaining = (GImGui->BeginPopupStack).Size;
  if (((popup_flags & 0x20U) != 0) && (bVar6 = IsPopupOpen(0,0x80), bVar6)) {
    return;
  }
  local_68.Window = (ImGuiWindow *)0x0;
  local_68.OpenPopupPos.x = 0.0;
  local_68.OpenPopupPos.y = 0.0;
  local_68.OpenMousePos.x = 0.0;
  local_68.OpenMousePos.y = 0.0;
  local_68._52_4_ = 0;
  local_68._4_4_ = 0;
  local_68.PopupId = id;
  local_68.BackupNavWindow = pIVar5->NavWindow;
  iVar1 = pIVar5->FrameCount;
  local_68.OpenFrameCount = iVar1;
  local_68.ParentNavLayer = -1;
  local_68.OpenParentId = (pIVar2->IDStack).Data[(long)(pIVar2->IDStack).Size + -1];
  IVar4 = NavCalcPreferredRefPos();
  local_68.OpenPopupPos.x = IVar4.x;
  local_68.OpenPopupPos.y = IVar4.y;
  pIVar7 = &(pIVar5->IO).MousePos;
  if ((pIVar5->IO).MousePos.y < -256000.0 || (pIVar5->IO).MousePos.x < -256000.0) {
    pIVar7 = &local_68.OpenPopupPos;
  }
  local_68.OpenMousePos.x = (*pIVar7).x;
  local_68.OpenMousePos.y = (*pIVar7).y;
  if ((pIVar5->DebugLogFlags & 4) != 0) {
    DebugLog("[popup] OpenPopupEx(0x%08X)\n");
  }
  if (remaining < (pIVar5->OpenPopupStack).Size) {
    pIVar3 = (pIVar5->OpenPopupStack).Data;
    if ((pIVar3[remaining].PopupId == id) &&
       (pIVar3[remaining].OpenFrameCount == pIVar5->FrameCount + -1)) {
      pIVar3[remaining].OpenFrameCount = iVar1;
      return;
    }
    ClosePopupToLevel(remaining,false);
  }
  ImVector<ImGuiPopupData>::push_back(&pIVar5->OpenPopupStack,&local_68);
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    const int current_stack_size = g.BeginPopupStack.Size;

    if (popup_flags & ImGuiPopupFlags_NoOpenOverExistingPopup)
        if (IsPopupOpen(0u, ImGuiPopupFlags_AnyPopupId))
            return;

    ImGuiPopupData popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.BackupNavWindow = g.NavWindow;            // When popup closes focus may be restored to NavWindow (depend on window type).
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    IMGUI_DEBUG_LOG_POPUP("[popup] OpenPopupEx(0x%08X)\n", id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            ClosePopupToLevel(current_stack_size, false);
            g.OpenPopupStack.push_back(popup_ref);
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}